

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::ConcurrentDatabase::write_exported_concurrent_hashes
          (ConcurrentDatabase *this,ResourceTag tag,ExportedMetadataConcurrentPrimedBlock *primed,
          uint64_t *total_count)

{
  bool bVar1;
  uint uVar2;
  unique_ptr *this_00;
  pointer pDVar3;
  unsigned_long *puVar4;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> *e;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
  *__range2;
  size_t hash_count;
  ExportedMetadataConcurrentPrimedBlock *primed_begin;
  uint64_t *total_count_local;
  ExportedMetadataConcurrentPrimedBlock *primed_local;
  ConcurrentDatabase *pCStack_18;
  ResourceTag tag_local;
  ConcurrentDatabase *this_local;
  
  __range2 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
              *)0x0;
  hash_count = (size_t)primed;
  primed_begin = total_count;
  total_count_local = primed;
  primed_local._4_4_ = tag;
  pCStack_18 = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
  if (bVar1) {
    pDVar3 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->readonly_interface);
    uVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,(ulong)primed_local._4_4_,&__range2,0);
    if ((uVar2 & 1) == 0) {
      return false;
    }
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->readonly_interface);
  if (bVar1) {
    pDVar3 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->readonly_interface);
    uVar2 = (*pDVar3->_vptr_DatabaseInterface[6])
                      (pDVar3,(ulong)primed_local._4_4_,&__range2,total_count_local);
    if ((uVar2 & 1) == 0) {
      return false;
    }
  }
  total_count_local = total_count_local + (long)__range2;
  __end2 = std::
           vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
           ::begin(&this->extra_readonly);
  e = (unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
       *)std::
         vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
         ::end(&this->extra_readonly);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
                                *)&e);
    if (!bVar1) {
      std::sort<unsigned_long*>((unsigned_long *)hash_count,total_count_local);
      puVar4 = std::unique<unsigned_long*>((unsigned_long *)hash_count,total_count_local);
      *primed_begin = (long)((long)puVar4 - hash_count) >> 3;
      return true;
    }
    this_00 = (unique_ptr *)
              __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
              ::operator*(&__end2);
    __range2 = (vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>
                *)0x0;
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      pDVar3 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)this_00);
      uVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,(ulong)primed_local._4_4_,&__range2,0);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      pDVar3 = std::
               unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ::operator->((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                             *)this_00);
      uVar2 = (*pDVar3->_vptr_DatabaseInterface[6])(pDVar3,(ulong)primed_local._4_4_,&__range2);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    total_count_local = total_count_local + (long)__range2;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_*,_std::vector<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>,_std::allocator<std::unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool write_exported_concurrent_hashes(ResourceTag tag, ExportedMetadataConcurrentPrimedBlock *primed, uint64_t &total_count) const
	{
		auto *primed_begin = primed;
		size_t hash_count = 0;

		// This is an upper bound, we might prune it later, although in general we don't expect duplicates.
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
			return false;
		if (readonly_interface &&
		    !readonly_interface->get_hash_list_for_resource_tag(tag, &hash_count, primed))
			return false;
		primed += hash_count;

		for (auto &e : extra_readonly)
		{
			hash_count = 0;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
				return false;
			if (e && !e->get_hash_list_for_resource_tag(tag, &hash_count, primed))
				return false;
			primed += hash_count;
		}

		std::sort(primed_begin, primed);
		primed = std::unique(primed_begin, primed);
		total_count = size_t(primed - primed_begin);
		return true;
	}